

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O3

http_header_t * httpmsg_find_hdr(http_message_t *msg,int header_name_id,memptr *value)

{
  ListNode *pLVar1;
  http_header_t *phVar2;
  http_header_t header;
  undefined1 auStack_68 [16];
  int local_58;
  
  phVar2 = (http_header_t *)0x0;
  local_58 = header_name_id;
  pLVar1 = ListFind(&msg->headers,(ListNode *)0x0,auStack_68);
  if ((pLVar1 != (ListNode *)0x0) &&
     (phVar2 = (http_header_t *)pLVar1->item, value != (memptr *)0x0)) {
    value->buf = (phVar2->value).buf;
    value->length = (phVar2->value).length;
  }
  return phVar2;
}

Assistant:

http_header_t *httpmsg_find_hdr(
	http_message_t *msg, int header_name_id, memptr *value)
{
	http_header_t header; /* temp header for searching */
	ListNode *node;
	http_header_t *data;

	header.name_id = header_name_id;
	node = ListFind(&msg->headers, NULL, &header);
	if (node == NULL) {
		return NULL;
	}
	data = (http_header_t *)node->item;
	if (value != NULL) {
		value->buf = data->value.buf;
		value->length = data->value.length;
	}

	return data;
}